

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_cipher_finish(psa_cipher_operation_t *operation,uint8_t *output,size_t output_size,
                 size_t *output_length)

{
  psa_status_t pVar1;
  uchar local_48 [8];
  uint8_t temp_output_buffer [16];
  int cipher_ret;
  psa_status_t status;
  size_t *output_length_local;
  size_t output_size_local;
  uint8_t *output_local;
  psa_cipher_operation_t *operation_local;
  
  temp_output_buffer[0xc] = '|';
  temp_output_buffer[0xd] = 0xff;
  temp_output_buffer[0xe] = 0xff;
  temp_output_buffer[0xf] = 0xff;
  temp_output_buffer[8] = 0x80;
  temp_output_buffer[9] = 0x9f;
  temp_output_buffer[10] = 0xff;
  temp_output_buffer[0xb] = 0xff;
  if ((operation->field_0x4 & 1) == 0) {
    return -0x89;
  }
  if ((((byte)operation->field_0x4 >> 1 & 1) != 0) && (((byte)operation->field_0x4 >> 2 & 1) == 0))
  {
    return -0x89;
  }
  if ((((operation->ctx).cipher.operation == MBEDTLS_ENCRYPT) && (operation->alg == 0x4600100)) &&
     ((operation->ctx).cipher.unprocessed_len != 0)) {
    temp_output_buffer[0xc] = 'y';
    temp_output_buffer[0xd] = 0xff;
    temp_output_buffer[0xe] = 0xff;
    temp_output_buffer[0xf] = 0xff;
  }
  else {
    temp_output_buffer._8_4_ =
         mbedtls_cipher_finish(&(operation->ctx).cipher,local_48,output_length);
    if (temp_output_buffer._8_4_ == 0) {
      if (*output_length != 0) {
        if (output_size < *output_length) {
          temp_output_buffer[0xc] = 'v';
          temp_output_buffer[0xd] = 0xff;
          temp_output_buffer[0xe] = 0xff;
          temp_output_buffer[0xf] = 0xff;
          goto LAB_001393fa;
        }
        memcpy(output,local_48,*output_length);
      }
      mbedtls_platform_zeroize(local_48,0x10);
      pVar1 = psa_cipher_abort(operation);
      return pVar1;
    }
    temp_output_buffer._12_4_ = mbedtls_to_psa_error(temp_output_buffer._8_4_);
  }
LAB_001393fa:
  *output_length = 0;
  mbedtls_platform_zeroize(local_48,0x10);
  psa_cipher_abort(operation);
  pVar1._0_1_ = temp_output_buffer[0xc];
  pVar1._1_1_ = temp_output_buffer[0xd];
  pVar1._2_1_ = temp_output_buffer[0xe];
  pVar1._3_1_ = temp_output_buffer[0xf];
  return pVar1;
}

Assistant:

psa_status_t psa_cipher_finish( psa_cipher_operation_t *operation,
                                uint8_t *output,
                                size_t output_size,
                                size_t *output_length )
{
    psa_status_t status = PSA_ERROR_GENERIC_ERROR;
    int cipher_ret = MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
    uint8_t temp_output_buffer[MBEDTLS_MAX_BLOCK_LENGTH];

    if( ! operation->key_set )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( operation->iv_required && ! operation->iv_set )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    if( operation->ctx.cipher.operation == MBEDTLS_ENCRYPT &&
        operation->alg == PSA_ALG_CBC_NO_PADDING &&
        operation->ctx.cipher.unprocessed_len != 0 )
    {
            status = PSA_ERROR_INVALID_ARGUMENT;
            goto error;
    }

    cipher_ret = mbedtls_cipher_finish( &operation->ctx.cipher,
                                        temp_output_buffer,
                                        output_length );
    if( cipher_ret != 0 )
    {
        status = mbedtls_to_psa_error( cipher_ret );
        goto error;
    }

    if( *output_length == 0 )
        ; /* Nothing to copy. Note that output may be NULL in this case. */
    else if( output_size >= *output_length )
        memcpy( output, temp_output_buffer, *output_length );
    else
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto error;
    }

    mbedtls_platform_zeroize( temp_output_buffer, sizeof( temp_output_buffer ) );
    status = psa_cipher_abort( operation );

    return( status );

error:

    *output_length = 0;

    mbedtls_platform_zeroize( temp_output_buffer, sizeof( temp_output_buffer ) );
    (void) psa_cipher_abort( operation );

    return( status );
}